

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iter_impl.hpp
# Opt level: O2

pointer __thiscall
nlohmann::json_abi_v3_11_3::detail::
iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
::operator->(iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
             *this)

{
  value_t vVar1;
  _Base_ptr p_Var2;
  json_value *pjVar3;
  _Base_ptr p_Var4;
  invalid_iterator *__return_storage_ptr__;
  allocator<char> local_39;
  string local_38;
  
  p_Var4 = (_Base_ptr)this->m_object;
  if (p_Var4 == (_Base_ptr)0x0) {
    __assert_fail("m_object != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/build_O2/_deps/nlohmann_json-src/include/nlohmann/detail/iterators/iter_impl.hpp"
                  ,0x146,
                  "pointer nlohmann::detail::iter_impl<const nlohmann::basic_json<>>::operator->() const [BasicJsonType = const nlohmann::basic_json<>]"
                 );
  }
  vVar1 = ((data *)&p_Var4->_M_color)->m_type;
  if (vVar1 == array) {
    pjVar3 = (json_value *)&p_Var4->_M_parent;
    p_Var4 = (_Base_ptr)(this->m_it).array_iterator._M_current;
    if (p_Var4 == (_Base_ptr)
                  (pjVar3->array->
                  super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish) {
      __assert_fail("m_it.array_iterator != m_object->m_data.m_value.array->end()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/build_O2/_deps/nlohmann_json-src/include/nlohmann/detail/iterators/iter_impl.hpp"
                    ,0x152,
                    "pointer nlohmann::detail::iter_impl<const nlohmann::basic_json<>>::operator->() const [BasicJsonType = const nlohmann::basic_json<>]"
                   );
    }
  }
  else if (vVar1 == object) {
    p_Var2 = (this->m_it).object_iterator._M_node;
    if ((_Rb_tree_header *)p_Var2 ==
        &(((json_value *)&p_Var4->_M_parent)->object->_M_t)._M_impl.super__Rb_tree_header) {
      __assert_fail("m_it.object_iterator != m_object->m_data.m_value.object->end()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/build_O2/_deps/nlohmann_json-src/include/nlohmann/detail/iterators/iter_impl.hpp"
                    ,0x14c,
                    "pointer nlohmann::detail::iter_impl<const nlohmann::basic_json<>>::operator->() const [BasicJsonType = const nlohmann::basic_json<>]"
                   );
    }
    p_Var4 = p_Var2 + 2;
  }
  else if ((this->m_it).primitive_iterator.m_it != 0) {
    __return_storage_ptr__ = (invalid_iterator *)__cxa_allocate_exception(0x20);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"cannot get value",&local_39);
    invalid_iterator::
    create<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_0>
              (__return_storage_ptr__,0xd6,&local_38,this->m_object);
    __cxa_throw(__return_storage_ptr__,&invalid_iterator::typeinfo,exception::~exception);
  }
  return (pointer)p_Var4;
}

Assistant:

pointer operator->() const
    {
        JSON_ASSERT(m_object != nullptr);

        switch (m_object->m_data.m_type)
        {
            case value_t::object:
            {
                JSON_ASSERT(m_it.object_iterator != m_object->m_data.m_value.object->end());
                return &(m_it.object_iterator->second);
            }

            case value_t::array:
            {
                JSON_ASSERT(m_it.array_iterator != m_object->m_data.m_value.array->end());
                return &*m_it.array_iterator;
            }

            case value_t::null:
            case value_t::string:
            case value_t::boolean:
            case value_t::number_integer:
            case value_t::number_unsigned:
            case value_t::number_float:
            case value_t::binary:
            case value_t::discarded:
            default:
            {
                if (JSON_HEDLEY_LIKELY(m_it.primitive_iterator.is_begin()))
                {
                    return m_object;
                }

                JSON_THROW(invalid_iterator::create(214, "cannot get value", m_object));
            }
        }
    }